

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O0

void __thiscall avro::Name::check(Name *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *msg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  string *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  _func_bool_char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool local_9a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  uVar2 = std::__cxx11::string::empty();
  local_9a = false;
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI._M_current);
    in_stack_ffffffffffffff57 = true;
    local_9a = (bool)in_stack_ffffffffffffff57;
    if (*pcVar3 != '.') {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI._M_current);
      in_stack_ffffffffffffff57 = true;
      local_9a = (bool)in_stack_ffffffffffffff57;
      if (*pcVar3 != '.') {
        std::__cxx11::string::begin();
        std::__cxx11::string::end();
        __last._M_current._7_1_ = in_stack_ffffffffffffff57;
        __last._M_current._0_7_ = in_stack_ffffffffffffff50;
        std::find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                  (in_RDI,__last,in_stack_ffffffffffffff48);
        std::__cxx11::string::end();
        in_stack_ffffffffffffff57 =
             __gnu_cxx::operator!=
                       ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_ffffffffffffff38);
        local_9a = (bool)in_stack_ffffffffffffff57;
      }
    }
  }
  if (local_9a != false) {
    uVar4 = __cxa_allocate_exception(0x18);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Exception::Exception
              ((Exception *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
  }
  bVar1 = std::__cxx11::string::empty();
  uVar5 = true;
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    __last_00._M_current._7_1_ = in_stack_ffffffffffffff57;
    __last_00._M_current._0_7_ = in_stack_ffffffffffffff50;
    std::find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
              (in_RDI,__last_00,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff88 = (char *)std::__cxx11::string::end();
    uVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(uVar5,in_stack_ffffffffffffff40),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff38);
  }
  if ((bool)uVar5 != false) {
    msg = (string *)__cxa_allocate_exception(0x18);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Exception::Exception((Exception *)CONCAT17(uVar5,in_stack_ffffffffffffff40),msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void Name::check() const
{
    if (! ns_.empty() && (ns_[0] == '.' || ns_[ns_.size() - 1] == '.' || std::find_if(ns_.begin(), ns_.end(), invalidChar1) != ns_.end())) {
        throw Exception("Invalid namespace: " + ns_);
    }
    if (simpleName_.empty() || std::find_if(simpleName_.begin(), simpleName_.end(), invalidChar2) != simpleName_.end()) {
        throw Exception("Invalid name: " + simpleName_);
    }
}